

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.h
# Opt level: O1

void __thiscall CChainParams::CChainParams(CChainParams *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  uint256 *puVar3;
  base_blob<256U> *pbVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar4 = &(this->consensus).hashGenesisBlock.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->consensus).hashGenesisBlock.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  puVar3 = &(this->consensus).hashGenesisBlock;
  (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->consensus).hashGenesisBlock.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  p_Var1 = &(this->consensus).script_flag_exceptions._M_t._M_impl.super__Rb_tree_header;
  (this->consensus).script_flag_exceptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  lVar5 = 0;
  (this->consensus).script_flag_exceptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->consensus).script_flag_exceptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->consensus).script_flag_exceptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->consensus).script_flag_exceptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar3 = &(this->consensus).BIP34Hash;
  (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->consensus).BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->consensus).BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->consensus).BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  do {
    *(undefined4 *)((long)&(this->consensus).vDeployments[0].bit + lVar5) = 0x1c;
    *(undefined8 *)((long)&(this->consensus).vDeployments[0].nStartTime + lVar5) =
         0xfffffffffffffffe;
    *(undefined8 *)((long)&(this->consensus).vDeployments[0].nTimeout + lVar5) = 0xfffffffffffffffe;
    *(undefined4 *)((long)&(this->consensus).vDeployments[0].min_activation_height + lVar5) = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x40);
  pbVar4 = &(this->consensus).powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->consensus).powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  puVar3 = &(this->consensus).powLimit;
  (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->consensus).powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  (this->consensus).signet_challenge.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->consensus).signet_challenge.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->consensus).signet_challenge.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar3 = &(this->consensus).nMinimumChainWork;
  (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->consensus).nMinimumChainWork.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->consensus).nMinimumChainWork.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->consensus).nMinimumChainWork.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  puVar3 = &(this->consensus).defaultAssumeValid;
  (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->consensus).defaultAssumeValid.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->consensus).defaultAssumeValid.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->consensus).defaultAssumeValid.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  (this->consensus).signet_blocks = false;
  memset(&this->vSeeds,0,0x90);
  (this->bech32_hrp)._M_dataplus._M_p = (pointer)&(this->bech32_hrp).field_2;
  (this->bech32_hrp)._M_string_length = 0;
  (this->bech32_hrp).field_2._M_local_buf[0] = '\0';
  (this->genesis).m_checked_witness_commitment = false;
  (this->genesis).m_checked_merkle_root = false;
  (this->genesis).super_CBlockHeader.nVersion = 0;
  (this->genesis).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (this->genesis).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (this->genesis).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (this->genesis).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pbVar4 = &(this->genesis).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[4] = '\0';
  (pbVar4->m_data)._M_elems[5] = '\0';
  (pbVar4->m_data)._M_elems[6] = '\0';
  (pbVar4->m_data)._M_elems[7] = '\0';
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  pbVar4 = &(this->genesis).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  pbVar4 = &(this->genesis).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((this->genesis).super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0x1c) =
       0;
  pbVar4 = &(this->genesis).super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[4] = '\0';
  (pbVar4->m_data)._M_elems[5] = '\0';
  (pbVar4->m_data)._M_elems[6] = '\0';
  (pbVar4->m_data)._M_elems[7] = '\0';
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  pbVar4 = &(this->genesis).super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  pbVar4 = &(this->genesis).super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  *(undefined8 *)
   ((this->genesis).super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c)
       = 0;
  (this->genesis).super_CBlockHeader.nBits = 0;
  (this->genesis).super_CBlockHeader.nNonce = 0;
  (this->genesis).vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->genesis).vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->genesis).vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear(&(this->genesis).vtx);
  (this->genesis).fChecked = false;
  (this->genesis).m_checked_witness_commitment = false;
  (this->genesis).m_checked_merkle_root = false;
  (this->vFixedSeeds).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vFixedSeeds).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vFixedSeeds).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header;
  (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    (this->m_assumeutxo_data).super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_assumeutxo_data).super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this->m_assumeutxo_data).super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

CChainParams() = default;